

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bump.hpp
# Opt level: O1

void __thiscall
tao::pegtl::internal::
memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>::bump
          (memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
           *this,size_t in_count)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (in_count != 0) {
    sVar2 = (this->m_current).line;
    sVar4 = (this->m_current).byte_in_line;
    sVar3 = 0;
    do {
      if ((this->m_current).data[sVar3] == '\n') {
        sVar2 = sVar2 + 1;
        (this->m_current).line = sVar2;
        sVar4 = 0;
      }
      else {
        sVar4 = sVar4 + 1;
      }
      (this->m_current).byte_in_line = sVar4;
      sVar3 = sVar3 + 1;
    } while (in_count != sVar3);
  }
  psVar1 = &(this->m_current).byte;
  *psVar1 = *psVar1 + in_count;
  (this->m_current).data = (this->m_current).data + in_count;
  return;
}

Assistant:

inline void bump( iterator& iter, const std::size_t count, const int ch ) noexcept
         {
            for( std::size_t i = 0; i < count; ++i ) {
               if( iter.data[ i ] == ch ) {
                  ++iter.line;
                  iter.byte_in_line = 0;
               }
               else {
                  ++iter.byte_in_line;
               }
            }
            iter.byte += count;
            iter.data += count;
         }